

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

void ncnn::copy_cut_border_image<signed_char>(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int x;
  int y;
  char *outptr;
  char *ptr;
  int h;
  int w;
  int local_38;
  int local_34;
  char *local_30;
  char *local_28;
  
  iVar1 = in_RSI->w;
  iVar2 = in_RSI->h;
  local_28 = Mat::row<signed_char>(in_RDI,in_EDX);
  local_28 = local_28 + in_ECX;
  local_30 = Mat::operator_cast_to_signed_char_(in_RSI);
  for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
    if (iVar1 < 0xc) {
      for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
        local_30[local_38] = local_28[local_38];
      }
    }
    else {
      memcpy(local_30,local_28,(long)iVar1);
    }
    local_30 = local_30 + iVar1;
    local_28 = local_28 + in_RDI->w;
  }
  return;
}

Assistant:

static void copy_cut_border_image(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src.row<T>(top) + left;
    T* outptr = dst;//.data;

    for (int y = 0; y < h; y++)
    {
        if(w < 12)
        {
            for (int x = 0; x < w; x++)
            {
                outptr[x] = ptr[x];
            }
        }
        else
        {
            memcpy(outptr, ptr, w*sizeof(T));
        }
        outptr += w;
        ptr += src.w;
    }
}